

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [2],
          StringPtr *params_2)

{
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  undefined8 local_30;
  long local_28;
  
  local_30 = *(undefined8 *)this;
  local_28 = *(long *)(this + 8) + -1;
  local_40.size_ = strlen((char *)params);
  local_50.ptr = *(char **)params_1;
  local_50.size_ = *(long *)(params_1 + 4) - 1;
  local_40.ptr = (char *)params;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,&local_50,&params_2->content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}